

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall EDCircles::JoinCircles(EDCircles *this)

{
  Circle *__src;
  uint uVar1;
  Circle *pCVar2;
  BufferManager *pBVar3;
  bool bVar4;
  int i;
  void *pvVar5;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  EDCircles *this_00;
  double *in_R9;
  uint N;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double *local_100;
  double error;
  double *local_c8;
  ulong local_c0;
  double local_b8;
  double r;
  double yc;
  double xc;
  double dStack_98;
  double local_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double local_70;
  EllipseEquation Eq;
  double *y;
  
  sortCircle(this->circles2,this->noCircles2);
  uVar1 = this->noCircles2;
  pCVar2 = this->circles2;
  uVar12 = 0;
  if (0 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  pdVar9 = &pCVar2->minorAxisLength;
  uVar13 = uVar12;
  while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
    if (*(bool *)(pdVar9 + -2) == true) {
      ComputeEllipseCenterAndAxisLengths
                ((EllipseEquation *)(pdVar9 + -10),(double *)(pdVar9 + -0x12),pdVar9 + -0x11,
                 pdVar9 + -1,pdVar9);
    }
    pdVar9 = pdVar9 + 0x13;
  }
  uVar13 = (long)(int)uVar1;
  if ((int)uVar1 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar13);
  for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    *(undefined1 *)((long)pvVar5 + uVar13) = 0;
  }
  uVar13 = (long)(int)uVar1 * 4;
  if ((int)uVar1 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar13);
  local_c8 = &pCVar2[1].minorAxisLength;
  uVar13 = 0;
LAB_0010ea92:
  if (uVar13 == uVar12) {
    operator_delete__(pvVar5);
    operator_delete__(piVar6);
    return;
  }
  if (*(char *)((long)pvVar5 + uVar13) == '\0') {
    __src = pCVar2 + uVar13;
    if (pCVar2[uVar13].isEllipse == true) {
      dVar17 = __src->minorAxisLength;
      dVar18 = __src->majorAxisLength;
    }
    else {
      dVar17 = __src->r;
      dVar18 = dVar17;
    }
    lVar14 = 0;
    uVar10 = 0;
    uVar7 = uVar13;
LAB_0010eae3:
    pdVar9 = local_c8 + uVar7 * 0x13;
    do {
      uVar7 = uVar7 + 1;
      if ((int)uVar1 <= (int)uVar7) {
        local_108 = __src->xc;
        local_110 = __src->yc;
        local_118 = __src->r;
        local_120 = __src->circleFitError;
        local_c0 = uVar13;
        EllipseEquation::EllipseEquation(&Eq);
        if ((int)uVar10 == 0) goto LAB_0010ef04;
        pBVar3 = this->bm;
        this_00 = (EDCircles *)(pBVar3->x + pBVar3->index);
        pdVar9 = pBVar3->y + pBVar3->index;
        local_100 = (double *)(long)__src->noPixels;
        memcpy(this_00,__src->x,(long)local_100 << 3);
        memcpy(pdVar9,__src->y,(long)local_100 << 3);
        bVar15 = false;
        bVar4 = false;
        piVar8 = piVar6;
        goto LAB_0010ec51;
      }
      if ((*(char *)((long)pvVar5 + uVar7) == '\0') &&
         (dVar19 = __src->xc - ((Circle *)(pdVar9 + -0x12))->xc, dVar20 = __src->yc - pdVar9[-0x11],
         SQRT(dVar19 * dVar19 + dVar20 * dVar20) <= 12.0)) {
        if (*(bool *)(pdVar9 + -2) == true) {
          dVar19 = *pdVar9;
          dVar20 = pdVar9[-1];
        }
        else {
          dVar19 = pdVar9[-0x10];
          dVar20 = dVar19;
        }
        if ((ABS(dVar18 - dVar20) <= 6.0) && (ABS(dVar17 - dVar19) <= 6.0)) goto LAB_0010eb85;
      }
      pdVar9 = pdVar9 + 0x13;
    } while( true );
  }
  goto LAB_0010ef52;
LAB_0010ec51:
  bVar16 = lVar14 == 0;
  lVar14 = lVar14 + -1;
  if (bVar16) goto LAB_0010ee58;
  lVar11 = (long)*piVar8;
  memcpy(&(this_00->super_EDPF).super_ED.width + (long)(int)local_100 * 2,pCVar2[lVar11].x,
         (long)pCVar2[lVar11].noPixels << 3);
  memcpy(pdVar9 + (int)local_100,pCVar2[lVar11].y,(long)pCVar2[lVar11].noPixels << 3);
  N = (int)local_100 + pCVar2[lVar11].noPixels;
  y = (double *)(ulong)N;
  if (((bVar4) || (__src->isEllipse != false)) || (pCVar2[lVar11].isEllipse != false)) {
LAB_0010ed41:
    EllipseEquation::EllipseEquation((EllipseEquation *)&xc);
    bVar16 = EllipseFit(this_00,pdVar9,y,(int)(EllipseEquation *)&xc,(EllipseEquation *)0x1,
                        (int)in_R9);
    if ((bVar16) &&
       (dVar17 = ComputeEllipseError((EllipseEquation *)&xc,(double *)this_00,pdVar9,N),
       dVar17 <= 2.0)) {
      *(undefined1 *)((long)pvVar5 + lVar11) = 1;
      Eq.coeff[6] = local_70;
      Eq.coeff[4] = local_80;
      Eq.coeff[5] = dStack_78;
      Eq.coeff[2] = local_90;
      Eq.coeff[3] = dStack_88;
      Eq.coeff[0] = xc;
      Eq.coeff[1] = dStack_98;
      bVar4 = true;
      bVar15 = false;
      local_100 = y;
      local_b8 = dVar17;
    }
  }
  else {
    error = 10000000000.0;
    in_R9 = &r;
    CircleFit((double *)this_00,pdVar9,N,&xc,&yc,in_R9,&error);
    if (2.0 < error) goto LAB_0010ed41;
    *(undefined1 *)((long)pvVar5 + lVar11) = 1;
    local_108 = xc;
    local_110 = yc;
    local_118 = r;
    bVar15 = true;
    local_120 = error;
    local_100 = y;
  }
  piVar8 = piVar8 + 1;
  goto LAB_0010ec51;
LAB_0010ee58:
  if (bVar15) {
    addCircle(this->circles3,&this->noCircles3,local_108,local_110,local_118,local_120,(double *)0x0
              ,(double *)0x0,0);
    uVar13 = local_c0;
  }
  else if (bVar4) {
    in_R9 = (double *)0x0;
    addCircle(this->circles3,&this->noCircles3,local_108,local_110,local_118,local_120,&Eq,local_b8,
              (double *)0x0,(double *)0x0,0);
    uVar13 = local_c0;
  }
  else {
LAB_0010ef04:
    memcpy(this->circles3 + this->noCircles3,__src,0x98);
    this->noCircles3 = this->noCircles3 + 1;
    uVar13 = local_c0;
  }
LAB_0010ef52:
  uVar13 = uVar13 + 1;
  goto LAB_0010ea92;
LAB_0010eb85:
  piVar6[uVar10] = (int)uVar7;
  uVar10 = (ulong)((int)uVar10 + 1);
  lVar14 = lVar14 + 1;
  goto LAB_0010eae3;
}

Assistant:

void EDCircles::JoinCircles()
{
	// Sort the circles wrt their radius
	sortCircle(circles2, noCircles2);

	int noCircles = noCircles2;
	Circle *circles = circles2;

	for (int i = 0; i<noCircles; i++) {
		if (circles[i].isEllipse) {
			ComputeEllipseCenterAndAxisLengths(&circles[i].eq, &circles[i].xc, &circles[i].yc, &circles[i].majorAxisLength, &circles[i].minorAxisLength);
		} //end-if
	} //end-for

	bool *taken = new bool[noCircles];
	for (int i = 0; i<noCircles; i++) taken[i] = false;

	int *candidateCircles = new int[noCircles];
	int noCandidateCircles;

	for (int i = 0; i<noCircles; i++) {
		if (taken[i]) continue;

		// Current arc
		double majorAxisLength, minorAxisLength;

		if (circles[i].isEllipse) {
			majorAxisLength = circles[i].majorAxisLength;
			minorAxisLength = circles[i].minorAxisLength;

		}
		else {
			majorAxisLength = circles[i].r;
			minorAxisLength = circles[i].r;
		} //end-else

		  // Find other circles to join with
		noCandidateCircles = 0;

		for (int j = i + 1; j<noCircles; j++) {
			if (taken[j]) continue;

#define JOINED_SHORT_ARC_ERROR_THRESHOLD  2 // 2.5
#define AXIS_LENGTH_DIFF_THRESHOLD     6 //(JOINED_SHORT_ARC_ERROR_THRESHOLD*2+1)
#define CENTER_DISTANCE_THRESHOLD      12 //(AXIS_LENGTH_DIFF_THRESHOLD*2)

			double dx = circles[i].xc - circles[j].xc;
			double dy = circles[i].yc - circles[j].yc;
			double centerDistance = sqrt(dx*dx + dy*dy);
			if (centerDistance > CENTER_DISTANCE_THRESHOLD) continue;

			double diff1, diff2;
			if (circles[j].isEllipse) {
				diff1 = fabs(majorAxisLength - circles[j].majorAxisLength);
				diff2 = fabs(minorAxisLength - circles[j].minorAxisLength);

			}
			else {
				diff1 = fabs(majorAxisLength - circles[j].r);
				diff2 = fabs(minorAxisLength - circles[j].r);
			} //end-else

			if (diff1 > AXIS_LENGTH_DIFF_THRESHOLD) continue;
			if (diff2 > AXIS_LENGTH_DIFF_THRESHOLD) continue;

			// Add to candidates
			candidateCircles[noCandidateCircles] = j;
			noCandidateCircles++;
		} //end-for

		  // Try to join the current arc with the candidate arc (if there is one)
		double XC = circles[i].xc;
		double YC = circles[i].yc;
		double R = circles[i].r;

		double CircleFitError = circles[i].circleFitError;
		bool CircleFitValid = false;

		EllipseEquation Eq;
		double EllipseFitError;
		bool EllipseFitValid = false;

		if (noCandidateCircles > 0) {
			int noPixels = circles[i].noPixels;
			double *x = bm->getX();
			double *y = bm->getY();
			memcpy(x, circles[i].x, noPixels * sizeof(double));
			memcpy(y, circles[i].y, noPixels * sizeof(double));

			for (int j = 0; j<noCandidateCircles; j++) {
				int CandidateArcNo = candidateCircles[j];

				int noPixelsSave = noPixels;
				memcpy(x + noPixels, circles[CandidateArcNo].x, circles[CandidateArcNo].noPixels * sizeof(double));
				memcpy(y + noPixels, circles[CandidateArcNo].y, circles[CandidateArcNo].noPixels * sizeof(double));
				noPixels += circles[CandidateArcNo].noPixels;

				bool circleFitOK = false;
				if (EllipseFitValid == false && circles[i].isEllipse == false && circles[CandidateArcNo].isEllipse == false) {
					double xc, yc, r, error = 1e10;
					CircleFit(x, y, noPixels, &xc, &yc, &r, &error);

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						XC = xc;
						YC = yc;
						R = r;
						CircleFitError = error;

						circleFitOK = true;
						CircleFitValid = true;
					} //end-if
				} // end-if

				bool ellipseFitOK = false;
				if (circleFitOK == false) {
					// Try to fit an ellipse
					double error = 1e10;
					EllipseEquation eq;
					if (EllipseFit(x, y, noPixels, &eq)) {
						error = ComputeEllipseError(&eq, x, y, noPixels);
					} //end-if

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						Eq = eq;
						EllipseFitError = error;

						ellipseFitOK = true;
						EllipseFitValid = true;
						CircleFitValid = false;
					} // end-if
				} //end-if

				if (circleFitOK == false && ellipseFitOK == false) {
					noPixels = noPixelsSave;
				} //end-if
			} // end-for
		} //end-if

		// Add the new circle/ellipse to circles2
		if (CircleFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, NULL, NULL, 0);

		}
		else if (EllipseFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, &Eq, EllipseFitError, NULL, NULL, 0);

		}
		else {
			circles3[noCircles3] = circles[i];
			noCircles3++;
		} //end-else
	} //end-for

	delete[] taken;
	delete[] candidateCircles;
}